

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O0

filepos_t __thiscall
libmatroska::KaxInternalBlock::UpdateSize(KaxInternalBlock *this,bool param_1,bool param_2)

{
  uint uVar1;
  uint uVar2;
  bool bSizeFinite;
  int iVar3;
  int iVar4;
  binary *pbVar5;
  size_type sVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  reference ppDVar7;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  uint local_1c;
  LacingType local_18;
  uint i;
  LacingType LacingHere;
  bool param_2_local;
  bool param_1_local;
  KaxInternalBlock *this_local;
  
  pbVar5 = libebml::EbmlBinary::GetBuffer(&this->super_EbmlBinary);
  if (pbVar5 != (binary *)0x0) {
    __assert_fail("EbmlBinary::GetBuffer() == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                  ,0xa9,"virtual filepos_t libmatroska::KaxInternalBlock::UpdateSize(bool, bool)");
  }
  if (0x3fff < this->TrackNumber) {
    __assert_fail("TrackNumber < 0x4000",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                  ,0xaa,"virtual filepos_t libmatroska::KaxInternalBlock::UpdateSize(bool, bool)");
  }
  sVar6 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>::size
                    (&this->myBuffers);
  if (sVar6 == 0) {
    libebml::EbmlElement::SetSize_((EbmlElement *)this,0);
  }
  else if (sVar6 == 1) {
    ppDVar7 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>::
              operator[](&this->myBuffers,0);
    iVar3 = (*(*ppDVar7)->_vptr_DataBuffer[3])();
    libebml::EbmlElement::SetSize_
              ((EbmlElement *)this,(ulong)(*(int *)CONCAT44(extraout_var,iVar3) + 4));
  }
  else {
    libebml::EbmlElement::SetSize_((EbmlElement *)this,5);
    if (this->mLacing == LACING_AUTO) {
      local_18 = GetBestLacingType(this);
    }
    else {
      local_18 = this->mLacing;
    }
    if (local_18 == LACING_XIPH) {
      for (local_1c = 0;
          sVar6 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                  ::size(&this->myBuffers), (ulong)local_1c < sVar6 - 1; local_1c = local_1c + 1) {
        iVar3 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
        ppDVar7 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                  ::operator[](&this->myBuffers,(ulong)local_1c);
        iVar4 = (*(*ppDVar7)->_vptr_DataBuffer[3])();
        uVar1 = *(uint *)CONCAT44(extraout_var_01,iVar4);
        ppDVar7 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                  ::operator[](&this->myBuffers,(ulong)local_1c);
        iVar4 = (*(*ppDVar7)->_vptr_DataBuffer[3])();
        libebml::EbmlElement::SetSize_
                  ((EbmlElement *)this,
                   CONCAT44(extraout_var_00,iVar3) + (ulong)uVar1 +
                   (ulong)(*(uint *)CONCAT44(extraout_var_02,iVar4) / 0xff + 1));
      }
    }
    else if (local_18 == LACING_FIXED) {
      for (local_1c = 0;
          sVar6 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                  ::size(&this->myBuffers), (ulong)local_1c < sVar6 - 1; local_1c = local_1c + 1) {
        iVar3 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
        ppDVar7 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                  ::operator[](&this->myBuffers,(ulong)local_1c);
        iVar4 = (*(*ppDVar7)->_vptr_DataBuffer[3])();
        libebml::EbmlElement::SetSize_
                  ((EbmlElement *)this,
                   CONCAT44(extraout_var_10,iVar3) + (ulong)*(uint *)CONCAT44(extraout_var_11,iVar4)
                  );
      }
    }
    else {
      if (local_18 != LACING_EBML) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                      ,0xce,
                      "virtual filepos_t libmatroska::KaxInternalBlock::UpdateSize(bool, bool)");
      }
      iVar3 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
      ppDVar7 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>::
                operator[](&this->myBuffers,0);
      iVar4 = (*(*ppDVar7)->_vptr_DataBuffer[3])();
      uVar1 = *(uint *)CONCAT44(extraout_var_04,iVar4);
      ppDVar7 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>::
                operator[](&this->myBuffers,0);
      iVar4 = (*(*ppDVar7)->_vptr_DataBuffer[3])();
      uVar2 = *(uint *)CONCAT44(extraout_var_05,iVar4);
      bSizeFinite = libebml::EbmlElement::IsFiniteSize((EbmlElement *)this);
      iVar4 = libebml::CodedSizeLength((ulong)uVar2,0,bSizeFinite);
      libebml::EbmlElement::SetSize_
                ((EbmlElement *)this,CONCAT44(extraout_var_03,iVar3) + (ulong)uVar1 + (long)iVar4);
      for (local_1c = 1;
          sVar6 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                  ::size(&this->myBuffers), (ulong)local_1c < sVar6 - 1; local_1c = local_1c + 1) {
        iVar3 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
        ppDVar7 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                  ::operator[](&this->myBuffers,(ulong)local_1c);
        iVar4 = (*(*ppDVar7)->_vptr_DataBuffer[3])();
        uVar1 = *(uint *)CONCAT44(extraout_var_07,iVar4);
        ppDVar7 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                  ::operator[](&this->myBuffers,(ulong)local_1c);
        iVar4 = (*(*ppDVar7)->_vptr_DataBuffer[3])();
        uVar2 = *(uint *)CONCAT44(extraout_var_08,iVar4);
        ppDVar7 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                  ::operator[](&this->myBuffers,(ulong)(local_1c - 1));
        iVar4 = (*(*ppDVar7)->_vptr_DataBuffer[3])();
        iVar4 = libebml::CodedSizeLengthSigned
                          ((ulong)uVar2 - (ulong)*(uint *)CONCAT44(extraout_var_09,iVar4),0);
        libebml::EbmlElement::SetSize_
                  ((EbmlElement *)this,CONCAT44(extraout_var_06,iVar3) + (ulong)uVar1 + (long)iVar4)
        ;
      }
    }
    iVar3 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
    ppDVar7 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>::
              operator[](&this->myBuffers,(ulong)local_1c);
    iVar4 = (*(*ppDVar7)->_vptr_DataBuffer[3])();
    libebml::EbmlElement::SetSize_
              ((EbmlElement *)this,
               CONCAT44(extraout_var_12,iVar3) + (ulong)*(uint *)CONCAT44(extraout_var_13,iVar4));
  }
  if (0x7f < this->TrackNumber) {
    iVar3 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
    libebml::EbmlElement::SetSize_((EbmlElement *)this,CONCAT44(extraout_var_14,iVar3) + 1);
  }
  iVar3 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
  return CONCAT44(extraout_var_15,iVar3);
}

Assistant:

filepos_t KaxInternalBlock::UpdateSize(bool /* bSaveDefault */, bool /* bForceRender */)
{
  LacingType LacingHere;
  assert(EbmlBinary::GetBuffer() == NULL); // Data is not used for KaxInternalBlock
  assert(TrackNumber < 0x4000); // no more allowed for the moment
  unsigned int i;

  // compute the final size of the data
  switch (myBuffers.size()) {
    case 0:
      SetSize_(0);
      break;
    case 1:
      SetSize_(4 + myBuffers[0]->Size());
      break;
    default:
      SetSize_(4 + 1); // 1 for the lacing head
      if (mLacing == LACING_AUTO)
        LacingHere = GetBestLacingType();
      else
        LacingHere = mLacing;
      switch (LacingHere) {
        case LACING_XIPH:
          for (i=0; i<myBuffers.size()-1; i++) {
            SetSize_(GetSize() + myBuffers[i]->Size() + (myBuffers[i]->Size() / 0xFF + 1));
          }
          break;
        case LACING_EBML:
          SetSize_(GetSize() + myBuffers[0]->Size() + CodedSizeLength(myBuffers[0]->Size(), 0, IsFiniteSize()));
          for (i=1; i<myBuffers.size()-1; i++) {
            SetSize_(GetSize() + myBuffers[i]->Size() + CodedSizeLengthSigned(int64(myBuffers[i]->Size()) - int64(myBuffers[i-1]->Size()), 0));
          }
          break;
        case LACING_FIXED:
          for (i=0; i<myBuffers.size()-1; i++) {
            SetSize_(GetSize() + myBuffers[i]->Size());
          }
          break;
        default:
          i = 0;
          assert(0);
      }
      // Size of the last frame (not in lace)
      SetSize_(GetSize() + myBuffers[i]->Size());
      break;
  }

  if (TrackNumber >= 0x80)
    SetSize_(GetSize() + 1); // the size will be coded with one more octet

  return GetSize();
}